

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

ConstTestNodeIterator * __thiscall
xe::ConstTestNodeIterator::operator++(ConstTestNodeIterator *this)

{
  pointer pGVar1;
  TestGroup *pTVar2;
  pointer pGVar3;
  pointer pGVar4;
  int iVar5;
  int iVar6;
  GroupState local_18;
  
  local_18.group = (TestGroup *)operator*(this);
  if ((((local_18.group)->super_TestNode).m_nodeType < TESTNODETYPE_TEST_CASE) &&
     (0 < (int)((ulong)((long)((local_18.group)->m_children).
                              super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)((local_18.group)->m_children).
                             super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3))) {
    local_18.childNdx = 0;
    std::
    vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
    ::emplace_back<xe::ConstTestNodeIterator::GroupState>(&this->m_iterStack,&local_18);
  }
  else {
    pGVar1 = (this->m_iterStack).
             super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pGVar3 = (this->m_iterStack).
             super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pGVar4 = pGVar3 + -1;
      pTVar2 = pGVar4->group;
      iVar5 = 1;
      if (pTVar2 != (TestGroup *)0x0) {
        iVar5 = (int)((ulong)((long)(pTVar2->m_children).
                                    super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar2->m_children).
                                   super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
      iVar6 = pGVar3[-1].childNdx + 1;
      pGVar3[-1].childNdx = iVar6;
    } while ((iVar6 == iVar5) &&
            ((this->m_iterStack).
             super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
             ._M_impl.super__Vector_impl_data._M_finish = pGVar4, pGVar3 = pGVar4, pGVar4 != pGVar1)
            );
  }
  return this;
}

Assistant:

ConstTestNodeIterator& ConstTestNodeIterator::operator++ (void)
{
	DE_ASSERT(!m_iterStack.empty());

	const TestNode*	curNode			= **this;
	TestNodeType	curNodeType		= curNode->getNodeType();

	if ((curNodeType == TESTNODETYPE_GROUP || curNodeType == TESTNODETYPE_ROOT) &&
		static_cast<const TestGroup*>(curNode)->getNumChildren() > 0)
	{
		m_iterStack.push_back(GroupState(static_cast<const TestGroup*>(curNode)));
	}
	else
	{
		for (;;)
		{
			const TestGroup*	group		= m_iterStack.back().group;
			int&				childNdx	= m_iterStack.back().childNdx;
			int					numChildren	= group ? group->getNumChildren() : 1;

			childNdx += 1;
			if (childNdx == numChildren)
			{
				m_iterStack.pop_back();
				if (m_iterStack.empty())
					break;
			}
			else
				break;
		}
	}

	return *this;
}